

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETestSuite.cpp
# Opt level: O2

bool __thiscall
CETestSuite::test_vect_<double>
          (CETestSuite *this,vector<double,_std::allocator<double>_> *value,
          vector<double,_std::allocator<double>_> *expected,double *tol,string *function,int *line)

{
  string *__return_storage_ptr__;
  double dVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  CETestSuite *pCVar5;
  bool bVar6;
  bool isMatch;
  undefined1 local_159;
  string *local_158;
  int *local_150;
  CETestSuite *local_148;
  double *local_140;
  vector<double,_std::allocator<double>_> *local_138;
  vector<double,_std::allocator<double>_> *local_130;
  double local_128;
  undefined8 uStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  undefined1 local_b0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_159 = 1;
  lVar2 = *(long *)value;
  lVar4 = *(long *)(value + 8);
  local_130 = value;
  if (lVar4 - lVar2 == *(long *)(expected + 8) - *(long *)expected) {
    bVar6 = true;
    __return_storage_ptr__ = (string *)(local_b0 + 0x20);
    local_158 = function;
    local_150 = line;
    local_148 = this;
    local_140 = tol;
    local_138 = expected;
    for (uVar3 = 0; this = local_148, uVar3 < (ulong)(lVar4 - lVar2 >> 3); uVar3 = uVar3 + 1) {
      dVar1 = *(double *)(*(long *)expected + uVar3 * 8);
      local_128 = ABS(*(double *)(lVar2 + uVar3 * 8) - dVar1);
      uStack_120 = 0;
      if (ABS(*tol * dVar1) < local_128) {
        std::__cxx11::to_string(&local_d0,(int)uVar3);
        std::operator+(&local_70,"VECTOR values at index ",&local_d0);
        std::operator+(&local_50,&local_70," ");
        std::operator+(&local_110,&local_50,"are NOT equal (difference = ");
        std::__cxx11::to_string(__return_storage_ptr__,local_128);
        std::operator+(&local_f0,&local_110,__return_storage_ptr__);
        pCVar5 = (CETestSuite *)local_b0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0
                       ,&local_f0,")");
        log_failure(pCVar5,(string *)local_b0,local_158,local_150);
        std::__cxx11::string::~string((string *)local_b0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d0);
        local_159 = 0;
        lVar2 = *(long *)local_130;
        lVar4 = *(long *)(local_130 + 8);
        bVar6 = false;
        tol = local_140;
        expected = local_138;
      }
    }
    if (!bVar6) goto LAB_00104a64;
    pCVar5 = (CETestSuite *)local_b0;
    std::__cxx11::string::string
              ((string *)local_b0,"VECTOR values and lengths ARE equal.",(allocator *)&local_f0);
    log_success(pCVar5,(string *)local_b0,local_158,local_150);
  }
  else {
    pCVar5 = (CETestSuite *)local_b0;
    std::__cxx11::string::string
              ((string *)local_b0,"VECTOR lengths are NOT equal.",(allocator *)&local_f0);
    log_failure(pCVar5,(string *)local_b0,function,line);
  }
  std::__cxx11::string::~string((string *)local_b0);
LAB_00104a64:
  (*this->_vptr_CETestSuite[0xf])(this,&local_159);
  return (bool)local_159;
}

Assistant:

bool CETestSuite::test_vect_(const std::vector<T>& value,
                             const std::vector<T>& expected,
                             const T&           tol,
                             const std::string& function,
                             const int&         line)
{
    bool isMatch = true;
    if (value.size() == expected.size()) {
        for (int i=0; i<value.size(); i++) {
            T rel_tol = std::fabs(expected[i] * tol);
            T diff    = std::fabs(value[i] - expected[i]);
            if (diff > rel_tol) {
                log_failure("VECTOR values at index "+std::to_string(i)+" " +
                            "are NOT equal (difference = " + 
                            std::to_string(diff) + ")", function, line);
                isMatch = false;
            }
        }

        // If there is a match, then we consider the vectors to be equal
        if (isMatch) {
            log_success("VECTOR values and lengths ARE equal.", function, line);
        }
    } else {
        log_failure("VECTOR lengths are NOT equal.", function, line);
    }

    update_pass(isMatch);
    return isMatch;
}